

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

void __thiscall FPaletteTester::MakeTexture(FPaletteTester *this)

{
  int iVar1;
  FRemapTablePtr *this_00;
  FRemapTable *pFVar2;
  BYTE local_34;
  BYTE *local_28;
  BYTE *p;
  int t;
  int k;
  int j;
  int i;
  FPaletteTester *this_local;
  
  iVar1 = this->WantTranslation;
  local_28 = this->Pixels;
  p._4_4_ = 0;
  for (k = 0; k < 0x10; k = k + 1) {
    for (t = 0; t < 0x10; t = t + 1) {
      if (iVar1 < 2) {
        local_34 = (BYTE)p._4_4_;
      }
      else {
        this_00 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                            (&translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>,
                             (long)(iVar1 + -2));
        pFVar2 = FRemapTablePtr::operator->(this_00);
        local_34 = pFVar2->Remap[p._4_4_];
      }
      *local_28 = local_34;
      p._4_4_ = p._4_4_ + 0x10;
      local_28 = local_28 + 1;
    }
    p._4_4_ = p._4_4_ + -0xff;
  }
  this->CurTranslation = iVar1;
  return;
}

Assistant:

void FPaletteTester::MakeTexture()
{
	int i, j, k, t;
	BYTE *p;

	t = WantTranslation;
	p = Pixels;
	k = 0;
	for (i = 0; i < 16; ++i)
	{
		for (j = 0; j < 16; ++j)
		{
			*p++ = (t > 1) ? translationtables[TRANSLATION_Standard][t - 2]->Remap[k] : k;
			k += 16;
		}
		k -= 255;
	}
	CurTranslation = t;
}